

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

cram_block * cram_new_block(cram_content_type content_type,int content_id)

{
  cram_block *pcVar1;
  
  pcVar1 = (cram_block *)malloc(0x40);
  if (pcVar1 == (cram_block *)0x0) {
    pcVar1 = (cram_block *)0x0;
  }
  else {
    pcVar1->method = RAW;
    pcVar1->orig_method = RAW;
    pcVar1->content_type = content_type;
    pcVar1->content_id = content_id;
    pcVar1->comp_size = 0;
    pcVar1->uncomp_size = 0;
    pcVar1->data = (uchar *)0x0;
    pcVar1->alloc = 0;
    pcVar1->byte = 0;
    pcVar1->bit = 7;
  }
  return pcVar1;
}

Assistant:

cram_block *cram_new_block(enum cram_content_type content_type,
			   int content_id) {
    cram_block *b = malloc(sizeof(*b));
    if (!b)
	return NULL;
    b->method = b->orig_method = RAW;
    b->content_type = content_type;
    b->content_id = content_id;
    b->comp_size = 0;
    b->uncomp_size = 0;
    b->data = NULL;
    b->alloc = 0;
    b->byte = 0;
    b->bit = 7; // MSB

    return b;
}